

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpseq.c
# Opt level: O3

sd_lookup_t * sd_find_seq(char *str,int use_header)

{
  UT_hash_table *pUVar1;
  uint uVar2;
  int iVar3;
  size_t __n;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  UT_hash_handle *pUVar11;
  sd_lookup_t *psVar12;
  
  psVar12 = sd_lookup;
  if (sd_lookup != (sd_lookup_t *)0x0) {
    __n = strlen(str);
    uVar2 = (uint)__n;
    pbVar4 = (byte *)str;
    if (uVar2 < 0xc) {
      uVar6 = 0x9e3779b9;
      uVar5 = 0xfeedbeef;
      uVar7 = 0x9e3779b9;
      uVar9 = uVar2;
    }
    else {
      uVar5 = 0xfeedbeef;
      uVar7 = 0x9e3779b9;
      uVar8 = __n & 0xffffffff;
      uVar6 = 0x9e3779b9;
      do {
        uVar5 = uVar5 + *(int *)(pbVar4 + 8);
        uVar9 = uVar5 >> 0xd ^ ((uVar6 + *(int *)pbVar4) - (uVar7 + *(int *)(pbVar4 + 4))) - uVar5;
        uVar7 = uVar9 << 8 ^ ((uVar7 + *(int *)(pbVar4 + 4)) - uVar5) - uVar9;
        uVar6 = uVar7 >> 0xd ^ (uVar5 - uVar9) - uVar7;
        uVar9 = uVar6 >> 0xc ^ (uVar9 - uVar7) - uVar6;
        uVar5 = uVar9 << 0x10 ^ (uVar7 - uVar6) - uVar9;
        uVar10 = uVar5 >> 5 ^ (uVar6 - uVar9) - uVar5;
        uVar6 = uVar10 >> 3 ^ (uVar9 - uVar5) - uVar10;
        uVar7 = uVar6 << 10 ^ (uVar5 - uVar10) - uVar6;
        uVar5 = uVar7 >> 0xf ^ (uVar10 - uVar6) - uVar7;
        pbVar4 = pbVar4 + 0xc;
        uVar9 = (int)uVar8 - 0xc;
        uVar8 = (ulong)uVar9;
      } while (0xb < uVar9);
    }
    uVar5 = uVar5 + uVar2;
    switch(uVar9) {
    case 0xb:
      uVar5 = (uint)pbVar4[10] * 0x1000000 + uVar5;
    case 10:
      uVar5 = (uint)pbVar4[9] * 0x10000 + uVar5;
    case 9:
      uVar5 = (uint)pbVar4[8] * 0x100 + uVar5;
    case 8:
      uVar7 = (uint)pbVar4[7] * 0x1000000 + uVar7;
    case 7:
      uVar7 = (uint)pbVar4[6] * 0x10000 + uVar7;
    case 6:
      uVar7 = (uint)pbVar4[5] * 0x100 + uVar7;
    case 5:
      uVar7 = pbVar4[4] + uVar7;
    case 4:
      uVar6 = (uint)pbVar4[3] * 0x1000000 + uVar6;
    case 3:
      uVar6 = (uint)pbVar4[2] * 0x10000 + uVar6;
    case 2:
      uVar6 = (uint)pbVar4[1] * 0x100 + uVar6;
    case 1:
      uVar6 = *pbVar4 + uVar6;
    default:
      uVar2 = uVar5 >> 0xd ^ (uVar6 - uVar5) - uVar7;
      uVar7 = uVar2 << 8 ^ (uVar7 - uVar5) - uVar2;
      uVar6 = uVar7 >> 0xd ^ (uVar5 - uVar2) - uVar7;
      uVar9 = uVar6 >> 0xc ^ (uVar2 - uVar7) - uVar6;
      uVar2 = uVar9 << 0x10 ^ (uVar7 - uVar6) - uVar9;
      uVar6 = uVar2 >> 5 ^ (uVar6 - uVar9) - uVar2;
      uVar9 = uVar6 >> 3 ^ (uVar9 - uVar2) - uVar6;
      uVar2 = uVar9 << 10 ^ (uVar2 - uVar6) - uVar9;
      pUVar1 = (psVar12->hh).tbl;
      pUVar11 = pUVar1->buckets[pUVar1->num_buckets - 1 & (uVar2 >> 0xf ^ uVar6 - (uVar9 + uVar2))].
                hh_head;
    }
    while (pUVar11 != (UT_hash_handle *)0x0) {
      psVar12 = (sd_lookup_t *)((long)pUVar11 - pUVar1->hho);
      if ((__n == (psVar12->hh).keylen) && (iVar3 = bcmp((psVar12->hh).key,str,__n), iVar3 == 0)) {
        return psVar12;
      }
      pUVar11 = (psVar12->hh).hh_next;
    }
  }
  return (sd_lookup_t *)0x0;
}

Assistant:

sd_lookup_t *sd_find_seq(char *str, int use_header)
{
	sd_lookup_t *s;
	HASH_FIND_STR(sd_lookup, str, s);
	if (s)
		return s;
	else
		return (sd_lookup_t *)NULL;
}